

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_ComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *MissileType_00;
  int MeleeDamage_00;
  AActor *self_00;
  MetaClass *pMVar1;
  bool bVar2;
  bool local_53;
  FSoundID local_50;
  FName local_4c;
  PClassActor *local_48;
  PClassActor *MissileType;
  FSoundID MeleeSound;
  int MeleeDamage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x3d3,
                  "int AF_AActor_A_ComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    _MeleeSound = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (_MeleeSound != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)_MeleeSound,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 != false) {
      pMVar1 = AActor::GetClass(_MeleeSound);
      MissileType._4_4_ = pMVar1->MeleeDamage;
      pMVar1 = AActor::GetClass(_MeleeSound);
      FSoundID::FSoundID((FSoundID *)&MissileType,&pMVar1->MeleeSound);
      pMVar1 = AActor::GetClass(_MeleeSound);
      FName::FName(&local_4c,&pMVar1->MissileName);
      local_48 = PClass::FindActor(&local_4c);
      self_00 = _MeleeSound;
      MeleeDamage_00 = MissileType._4_4_;
      FSoundID::FSoundID(&local_50,(FSoundID *)&MissileType);
      MissileType_00 = local_48;
      pMVar1 = AActor::GetClass(_MeleeSound);
      DoAttack(self_00,true,true,MeleeDamage_00,&local_50,MissileType_00,pMVar1->MissileHeight);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x3d3,
                  "int AF_AActor_A_ComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3d3,
                "int AF_AActor_A_ComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	int MeleeDamage = self->GetClass()->MeleeDamage;
	FSoundID MeleeSound = self->GetClass()->MeleeSound;
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, true, true, MeleeDamage, MeleeSound, MissileType, self->GetClass()->MissileHeight);
	return 0;
}